

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_edit.cc
# Opt level: O0

void rcg::anon_unknown_0::redraw
               (vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                *list,int *top_row,int focus_row,char *message)

{
  int row;
  int iVar1;
  int iVar2;
  size_type sVar3;
  char *in_RCX;
  int in_EDX;
  int *in_RSI;
  vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
  *in_RDI;
  int i;
  int rows;
  bool in_stack_0000003b;
  int in_stack_0000003c;
  NodeParam *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  int iVar5;
  
  if (_stdscr == 0) {
    row = -1;
  }
  else {
    row = *(short *)(_stdscr + 4) + 1;
  }
  iVar1 = row;
  erase();
  if (1 < iVar1) {
    iVar1 = iVar1 + -1;
    if (in_EDX < *in_RSI) {
      *in_RSI = in_EDX;
    }
    if (*in_RSI + iVar1 + -1 < in_EDX) {
      *in_RSI = (in_EDX - iVar1) + 1;
    }
    iVar4 = 0;
    while (iVar4 < iVar1) {
      iVar2 = *in_RSI + iVar4;
      sVar3 = std::
              vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
              ::size(in_RDI);
      iVar5 = iVar4;
      if (iVar2 < (int)sVar3) {
        std::
        vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
        ::operator[](in_RDI,(long)(*in_RSI + iVar4));
        redraw_line(row,(NodeParam *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),false,false);
      }
      iVar4 = iVar5 + 1;
    }
    if ((in_RCX == (char *)0x0) || (*in_RCX == '\0')) {
      std::
      vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
      ::operator[](in_RDI,(long)in_EDX);
      NodeParam::printTooltip(in_stack_00000040,in_stack_0000003c,in_stack_0000003b);
    }
    else {
      mvaddstr_eol((int)((ulong)in_RCX >> 0x20),(int)in_RCX,(char *)CONCAT44(iVar1,iVar4),
                   SUB41((uint)row >> 0x18,0));
    }
  }
  return;
}

Assistant:

void redraw(std::vector<NodeParam> &list, int &top_row, int focus_row, const char *message=0)
{
  int rows=getmaxy(stdscr);

  erase();

  if (rows > 1)
  {
    rows--; // last row is used for showing tool tips and errors

    // focus row must always be visible

    if (focus_row < top_row) top_row=focus_row;
    if (focus_row > top_row+rows-1) top_row=focus_row-rows+1;

    // print all visible rows

    for (int i=0; i<rows; i++)
    {
      if (top_row+i < static_cast<int>(list.size()))
      {
        redraw_line(i, list[top_row+i], focus_row == top_row+i);
      }
    }

    if (message && *message != '\0')
    {
      mvaddstr_eol(rows, 0, message, true);
    }
    else
    {
      list[focus_row].printTooltip(rows, true);
    }
  }
}